

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_tools.cpp
# Opt level: O0

bool __thiscall ON_Brep::CloseTrimGap(ON_Brep *this,ON_BrepTrim *trim0,ON_BrepTrim *trim1)

{
  double dVar1;
  double dVar2;
  ISO IVar3;
  ON_3dPoint from_pt;
  ON_3dPoint to_pt;
  int iVar4;
  int iVar5;
  uint uVar6;
  ON_BrepLoop *pOVar7;
  int *piVar8;
  double *pdVar9;
  ON_3dPoint local_190;
  ON_3dPoint local_178;
  ON_3dPoint local_160;
  ON_3dPoint local_148;
  undefined4 local_12c;
  int local_128;
  int coord1_lock;
  int coord0_lock;
  double local_118;
  double dStack_110;
  undefined8 local_108;
  double local_f8;
  undefined8 local_e8;
  ON_Line local_e0;
  undefined1 local_b0 [8];
  ON_3dPoint p;
  ON_3dPoint p1;
  ON_3dPoint p0;
  double t1;
  double t0;
  ON_Interval domain1;
  ON_Interval domain0;
  int lti;
  ON_BrepLoop *loop;
  ON_BrepTrim *trim1_local;
  ON_BrepTrim *trim0_local;
  ON_Brep *this_local;
  
  if (trim0->m_vi[1] != trim1->m_vi[0]) {
    return false;
  }
  if (trim0->m_li != trim1->m_li) {
    return false;
  }
  if ((trim0->m_li < 0) ||
     (iVar5 = trim0->m_li,
     iVar4 = ON_ClassArray<ON_BrepLoop>::Count((ON_ClassArray<ON_BrepLoop> *)&this->m_L),
     iVar4 <= iVar5)) {
    return false;
  }
  pOVar7 = ON_ClassArray<ON_BrepLoop>::operator[]
                     ((ON_ClassArray<ON_BrepLoop> *)&this->m_L,trim0->m_li);
  iVar5 = ON_SimpleArray<int>::Count(&pOVar7->m_ti);
  if ((iVar5 == 1) && (trim0->m_trim_index == trim1->m_trim_index)) {
    uVar6 = (*(trim0->super_ON_CurveProxy).super_ON_Curve.super_ON_Geometry.super_ON_Object.
              _vptr_ON_Object[0x34])();
    if ((uVar6 & 1) != 0) {
      return true;
    }
    domain0.m_t[1]._4_4_ = 0;
  }
  else {
    for (domain0.m_t[1]._4_4_ = 0; iVar5 = ON_SimpleArray<int>::Count(&pOVar7->m_ti),
        domain0.m_t[1]._4_4_ < iVar5; domain0.m_t[1]._4_4_ = domain0.m_t[1]._4_4_ + 1) {
      piVar8 = ON_SimpleArray<int>::operator[](&pOVar7->m_ti,domain0.m_t[1]._4_4_);
      if (*piVar8 == trim0->m_trim_index) {
        iVar5 = ON_SimpleArray<int>::Count(&pOVar7->m_ti);
        piVar8 = ON_SimpleArray<int>::operator[](&pOVar7->m_ti,(domain0.m_t[1]._4_4_ + 1) % iVar5);
        if (*piVar8 == trim1->m_trim_index) break;
      }
    }
  }
  iVar5 = ON_SimpleArray<int>::Count(&pOVar7->m_ti);
  if (iVar5 <= domain0.m_t[1]._4_4_) {
    return false;
  }
  (*(trim0->super_ON_CurveProxy).super_ON_Curve.super_ON_Geometry.super_ON_Object._vptr_ON_Object
    [0x25])();
  (*(trim1->super_ON_CurveProxy).super_ON_Curve.super_ON_Geometry.super_ON_Object._vptr_ON_Object
    [0x25])();
  pdVar9 = ON_Interval::operator[]((ON_Interval *)(domain1.m_t + 1),1);
  dVar1 = *pdVar9;
  pdVar9 = ON_Interval::operator[]((ON_Interval *)&t0,0);
  dVar2 = *pdVar9;
  ON_Curve::EvPoint((ON_Curve *)trim0,dVar1,(ON_3dPoint *)&p1.z,0,(int *)0x0);
  ON_Curve::EvPoint((ON_Curve *)trim1,dVar2,(ON_3dPoint *)&p.z,0,(int *)0x0);
  p1.y = 0.0;
  local_e8 = 0;
  local_f8 = p1.z;
  local_108 = 0;
  local_118 = p.z;
  dStack_110 = p1.x;
  from_pt.y = p0.x;
  from_pt.x = p1.z;
  from_pt.z = 0.0;
  to_pt.y = p1.x;
  to_pt.x = p.z;
  to_pt.z = 0.0;
  ON_Line::ON_Line(&local_e0,from_pt,to_pt);
  ON_Line::PointAt((ON_3dPoint *)local_b0,&local_e0,0.5);
  ON_Line::~ON_Line(&local_e0);
  if ((p1.z == p.z) && (!NAN(p1.z) && !NAN(p.z))) {
    local_b0 = (undefined1  [8])p1.z;
  }
  if ((p0.x == p1.x) && (!NAN(p0.x) && !NAN(p1.x))) {
    p.x = p0.x;
  }
  local_12c = 0xffffffff;
  IVar3 = trim0->m_iso;
  if (IVar3 == x_iso) {
LAB_005761c5:
    local_128 = 0;
  }
  else if (IVar3 == y_iso) {
LAB_005761d1:
    local_128 = 1;
  }
  else {
    if (IVar3 == W_iso) goto LAB_005761c5;
    if (IVar3 == S_iso) goto LAB_005761d1;
    if (IVar3 == E_iso) goto LAB_005761c5;
    if (IVar3 == N_iso) goto LAB_005761d1;
    local_128 = -1;
  }
  IVar3 = trim1->m_iso;
  if (IVar3 == x_iso) {
LAB_0057624b:
    local_12c = 0;
    if (local_128 == 0) {
      if ((trim0->m_iso == x_iso) && (trim1->m_iso != x_iso)) {
        local_b0 = (undefined1  [8])p.z;
      }
      else if ((trim0->m_iso == x_iso) || (trim1->m_iso != x_iso)) {
        ON_Curve::PointAtStart(&local_148,(ON_Curve *)trim0);
        dVar1 = ON_3dPoint::DistanceTo((ON_3dPoint *)&p1.z,&local_148);
        ON_Curve::PointAtEnd(&local_160,(ON_Curve *)trim1);
        dVar2 = ON_3dPoint::DistanceTo((ON_3dPoint *)&p.z,&local_160);
        if (dVar1 < dVar2) {
          local_b0 = (undefined1  [8])p.z;
        }
        else {
          local_b0 = (undefined1  [8])p1.z;
        }
      }
      else {
        local_b0 = (undefined1  [8])p1.z;
      }
    }
    else if (local_128 == 1) {
      local_b0 = (undefined1  [8])p.z;
      p.x = p0.x;
    }
    else {
      local_b0 = (undefined1  [8])p.z;
    }
  }
  else {
    if (IVar3 != y_iso) {
      if (IVar3 == W_iso) goto LAB_0057624b;
      if (IVar3 != S_iso) {
        if (IVar3 == E_iso) goto LAB_0057624b;
        if (IVar3 != N_iso) {
          if (local_128 == 0) {
            local_b0 = (undefined1  [8])p1.z;
          }
          else if (local_128 == 1) {
            p.x = p0.x;
          }
          goto LAB_00576506;
        }
      }
    }
    local_12c = 1;
    if (local_128 == 0) {
      local_b0 = (undefined1  [8])p1.z;
      p.x = p1.x;
    }
    else if (local_128 == 1) {
      if ((trim0->m_iso == x_iso) && (trim1->m_iso != x_iso)) {
        p.x = p1.x;
      }
      else if ((trim0->m_iso == x_iso) || (trim1->m_iso != x_iso)) {
        ON_Curve::PointAtStart(&local_178,(ON_Curve *)trim0);
        dVar1 = ON_3dPoint::DistanceTo((ON_3dPoint *)&p1.z,&local_178);
        ON_Curve::PointAtEnd(&local_190,(ON_Curve *)trim1);
        dVar2 = ON_3dPoint::DistanceTo((ON_3dPoint *)&p.z,&local_190);
        if (dVar1 < dVar2) {
          p.x = p1.x;
        }
        else {
          p.x = p0.x;
        }
      }
      else {
        p.x = p0.x;
      }
    }
    else {
      local_b0 = (undefined1  [8])p.z;
    }
  }
LAB_00576506:
  iVar5 = ON_ComparePoint(3,false,(double *)local_b0,&p1.z);
  if (iVar5 != 0) {
    (*(trim0->super_ON_CurveProxy).super_ON_Curve.super_ON_Geometry.super_ON_Object._vptr_ON_Object
      [0x3a])();
  }
  iVar5 = ON_ComparePoint(3,false,(double *)local_b0,&p.z);
  if (iVar5 != 0) {
    (*(trim1->super_ON_CurveProxy).super_ON_Curve.super_ON_Geometry.super_ON_Object._vptr_ON_Object
      [0x39])();
  }
  return true;
}

Assistant:

bool ON_Brep::CloseTrimGap( ON_BrepTrim& trim0, ON_BrepTrim& trim1 )
{

  // carefully close gap between end of prev_trim and start of next_trim

  // make sure trim0 and trim1 are adjacent trims in a trimming loop
  if ( trim0.m_vi[1] != trim1.m_vi[0] )
    return false;
  if ( trim0.m_li != trim1.m_li )
    return false;
  if ( trim0.m_li < 0 || trim0.m_li >= m_L.Count() )
    return false;
  ON_BrepLoop& loop = m_L[trim0.m_li];
  int lti;
  if ( loop.m_ti.Count() == 1 && trim0.m_trim_index == trim1.m_trim_index )
  {
    if ( trim0.IsClosed() )
      return true;
    lti = 0;
  }
  else
  {
    for ( lti = 0; lti < loop.m_ti.Count(); lti++ )
    {
      if ( loop.m_ti[lti] == trim0.m_trim_index && loop.m_ti[(lti+1)%loop.m_ti.Count()] == trim1.m_trim_index )
        break;
    }
  }
  if ( lti >= loop.m_ti.Count() )
    return false;

  // determine where trims end and where they should meet.
  ON_Interval domain0 = trim0.Domain();
  ON_Interval domain1 = trim1.Domain();
  double t0 = domain0[1];
  double t1 = domain1[0];
  ON_3dPoint p0, p1;
  trim0.EvPoint( t0, p0 );
  trim1.EvPoint( t1, p1 );
  p0.z = 0.0;
  p1.z = 0.0;
  ON_3dPoint p = ON_Line(p0,p1).PointAt(0.5);
  if ( p0.x == p1.x )
    p.x = p0.x;
  if ( p0.y == p1.y )
    p.y = p0.y;

  int coord0_lock = -1;
  int coord1_lock = -1;
  switch(trim0.m_iso)
  {
  case ON_Surface::x_iso:
  case ON_Surface::W_iso:
  case ON_Surface::E_iso:
    // vertical iso curve - lock x coordinate
    coord0_lock = 0;
    break;
  case ON_Surface::y_iso:
  case ON_Surface::S_iso:
  case ON_Surface::N_iso:
    // horizontal iso curve - lock y coordinate
    coord0_lock = 1;
    break;
  default:
    coord0_lock = -1;
  }

  switch(trim1.m_iso)
  {
  case ON_Surface::x_iso:
  case ON_Surface::W_iso:
  case ON_Surface::E_iso:
    // vertical iso curve - lock x coordinate
    coord1_lock = 0;
    switch(coord0_lock)
    {
    case 0:
      if ( ON_Surface::x_iso == trim0.m_iso && ON_Surface::x_iso != trim1.m_iso )
        p.x = p1.x; // trim1 is on surface edge
      else if ( ON_Surface::x_iso != trim0.m_iso && ON_Surface::x_iso == trim1.m_iso )
        p.x = p0.x; // trim0 is on surface edge
      else
      {
        // longest one wins
        if ( p0.DistanceTo(trim0.PointAtStart()) >= p1.DistanceTo(trim1.PointAtEnd()) )
          p.x = p0.x;
        else
          p.x = p1.x;
      }
      break;
    case 1:
      p.x = p1.x;
      p.y = p0.y;
      break;
    default:
      p.x = p1.x;
      break;
    }
    break;
  case ON_Surface::y_iso:
  case ON_Surface::S_iso:
  case ON_Surface::N_iso:
    // horizontal iso curve - lock y coordinate
    coord1_lock = 1;
    switch(coord0_lock)
    {
    case 0:
      p.x = p0.x;
      p.y = p1.y;
      break;
    case 1:
      if ( ON_Surface::x_iso == trim0.m_iso && ON_Surface::x_iso != trim1.m_iso )
        p.y = p1.y; // trim1 is on surface edge
      else if ( ON_Surface::x_iso != trim0.m_iso && ON_Surface::x_iso == trim1.m_iso )
        p.y = p0.y; // trim0 is on surface edge
      else
      {
        // longest one wins
        if ( p0.DistanceTo(trim0.PointAtStart()) >= p1.DistanceTo(trim1.PointAtEnd()) )
          p.y = p0.y;
        else
          p.y = p1.y;
      }
      break;
    default:
      p.x = p1.x;
      break;
    }
    break;
  default:
    switch(coord0_lock)
    {
    case 0:
      p.x = p0.x;
      break;
    case 1:
      p.y = p0.y;
      break;
    }
    break;
  }

  if (ON_ComparePoint(3,0,&p.x,&p0.x))
  {
    trim0.SetEndPoint(p);
  }
  if (ON_ComparePoint(3,0,&p.x,&p1.x))
  {
    trim1.SetStartPoint(p);
  }

  return true;
}